

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O2

void __thiscall V2Synth::setGlobals(V2Synth *this,uint8_t *para)

{
  int i;
  long lVar1;
  float fVar2;
  
  if (this->initialized == true) {
    for (lVar1 = 0; lVar1 != 0x17; lVar1 = lVar1 + 1) {
      (&(this->globals).rvbparm.revtime)[lVar1] = (float)para[lVar1];
    }
    V2Reverb::set(&this->reverb,&(this->globals).rvbparm);
    V2ModDel::set(&this->delay,&(this->globals).delparm);
    V2Comp::set(&this->compr,&(this->globals).cprparm);
    fVar2 = ((this->globals).vlowcut + 1.0) * 0.0078125;
    this->lcfreq = fVar2 * fVar2;
    fVar2 = ((this->globals).vhighcut + 1.0) * 0.0078125;
    this->hcfreq = fVar2 * fVar2;
  }
  return;
}

Assistant:

void setGlobals(const uint8_t *para)
    {
        if (!initialized)
            return;

        // copy over
        float *globf = (float *)&globals;
        for (int i = 0; i < (int)(sizeof(globals)/sizeof(float)); i++)
            globf[i] = para[i];

        // set
        reverb.set(&globals.rvbparm);
        delay.set(&globals.delparm);
        compr.set(&globals.cprparm);
        lcfreq = sqr((globals.vlowcut + 1.0f) / 128.0f);
        hcfreq = sqr((globals.vhighcut + 1.0f) / 128.0f);
    }